

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jobs.cpp
# Opt level: O0

void __thiscall
JsUtil::BackgroundJobProcessor::AddManager(BackgroundJobProcessor *this,JobManager *manager)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  AutoCriticalSection local_28;
  AutoCriticalSection lock;
  JobManager *local_18;
  JobManager *manager_local;
  BackgroundJobProcessor *this_local;
  
  local_18 = manager;
  manager_local = (JobManager *)this;
  if (manager == (JobManager *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x315,"(manager)","manager");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  lock.cs = (CriticalSection *)&local_18;
  IterateBackgroundThreads<JsUtil::BackgroundJobProcessor::AddManager(JsUtil::JobManager*)::__0>
            (this,(anon_class_8_1_b523428d)lock.cs);
  AutoCriticalSection::AutoCriticalSection(&local_28,&this->criticalSection);
  bVar2 = JobProcessor::IsClosed(&this->super_JobProcessor);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x31d,"(!IsClosed())","!IsClosed()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  JobProcessor::AddManager(&this->super_JobProcessor,local_18);
  IndicateNewJob(this);
  AutoCriticalSection::~AutoCriticalSection(&local_28);
  return;
}

Assistant:

void BackgroundJobProcessor::AddManager(JobManager *const manager)
    {
        Assert(manager);

        IterateBackgroundThreads([&manager](ParallelThreadData *threadData){
            manager->ProcessorThreadSpecificCallBack(threadData->GetPageAllocator());
            return false;
        });

        AutoCriticalSection lock(&criticalSection);
        Assert(!IsClosed());

        JobProcessor::AddManager(manager);


        IndicateNewJob();
    }